

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.cpp
# Opt level: O2

VariableType * __thiscall rsg::VariableType::getElementType(VariableType *this)

{
  Type baseType;
  VariableType *pVVar1;
  Exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  baseType = this->m_baseType;
  if (baseType < TYPE_LAST) {
    if ((0xceU >> (baseType & 0x1f) & 1) != 0) {
      pVVar1 = getScalarType(baseType);
      return pVVar1;
    }
    if (baseType == TYPE_ARRAY) {
      return this->m_elementType;
    }
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"VariableType::getElementType(): unsupported type",&local_39);
  Exception::Exception(this_00,&local_38);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const VariableType& VariableType::getElementType (void) const
{
	DE_ASSERT(m_precision == PRECISION_NONE); // \todo [pyry] Precision
	switch (m_baseType)
	{
		case TYPE_FLOAT:
		case TYPE_INT:
		case TYPE_BOOL:
		case TYPE_SAMPLER_2D:
		case TYPE_SAMPLER_CUBE:
			return getScalarType(m_baseType);

		case TYPE_ARRAY:
		{
			DE_ASSERT(m_elementType);
			return *m_elementType;
		}

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("VariableType::getElementType(): unsupported type");
	}
}